

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandBlockPo(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint nCycles;
  Abc_Ntk_t *pNtk;
  Aig_Man_t *pAig;
  Abc_Ntk_t *pNtk_00;
  char *pcVar4;
  
  nCycles = 0;
  Extra_UtilGetoptReset();
  bVar1 = false;
  do {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"Fvh"), iVar2 = globalUtilOptind, iVar3 == 0x76) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (iVar3 == -1) {
      pNtk = Abc_FrameReadNtk(pAbc);
      if (pNtk == (Abc_Ntk_t *)0x0) {
        pcVar4 = "Main AIG: There is no current network.\n";
      }
      else if (pNtk->ntkType == ABC_NTK_STRASH) {
        if (nCycles != 0) {
          pAig = Abc_NtkToDar(pNtk,0,1);
          Saig_ManBlockPo(pAig,nCycles);
          pNtk_00 = Abc_NtkFromAigPhase(pAig);
          Aig_ManStop(pAig);
          pcVar4 = Extra_UtilStrsav(pNtk->pName);
          pNtk_00->pName = pcVar4;
          pcVar4 = Extra_UtilStrsav(pNtk->pSpec);
          pNtk_00->pSpec = pcVar4;
          Abc_FrameReplaceCurrentNetwork(pAbc,pNtk_00);
          return 0;
        }
        pcVar4 = "The number of time frame is 0. The circuit is left unchanged.\n";
      }
      else {
        pcVar4 = "Main AIG: The current network is not an AIG.\n";
      }
      Abc_Print(1,pcVar4);
      return 0;
    }
    if (iVar3 == 0x68) break;
    if (iVar3 != 0x46) {
      Abc_Print(-2,"Unknown switch.\n");
      break;
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
      break;
    }
    nCycles = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar2 + 1;
  } while (-1 < (int)nCycles);
  Abc_Print(-2,"usage: blockpo [-F num] [-fvh]\n");
  Abc_Print(-2,"\t         forces the miter outputs to be \"true\" in the first F frames\n");
  Abc_Print(-2,"\t-F num : the number of time frames [default = %d]\n",(ulong)nCycles);
  pcVar4 = "yes";
  if (!bVar1) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle printing optimization summary [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandBlockPo( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkNew = NULL;
    Aig_Man_t * pAig;
    int c;
    int nCycles = 0;
    int fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Fvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nCycles = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCycles < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }

    // check the main AIG
    pNtk = Abc_FrameReadNtk(pAbc);
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Main AIG: There is no current network.\n");
        return 0;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( 1, "Main AIG: The current network is not an AIG.\n");
        return 0;
    }
    if ( nCycles == 0 )
    {
        Abc_Print( 1, "The number of time frame is 0. The circuit is left unchanged.\n" );
        return 0;
    }

    // transform
    pAig = Abc_NtkToDar( pNtk, 0, 1 );
    Saig_ManBlockPo( pAig, nCycles );
    pNtkNew = Abc_NtkFromAigPhase( pAig );
    Aig_ManStop( pAig );
    // transfer the name
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkNew );
    return 0;

usage:
    Abc_Print( -2, "usage: blockpo [-F num] [-fvh]\n" );
    Abc_Print( -2, "\t         forces the miter outputs to be \"true\" in the first F frames\n" );
    Abc_Print( -2, "\t-F num : the number of time frames [default = %d]\n", nCycles );
    Abc_Print( -2, "\t-v     : toggle printing optimization summary [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}